

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespace.cpp
# Opt level: O1

BOOL __thiscall Js::ModuleNamespace::IsEnumerable(ModuleNamespace *this,PropertyId propertyId)

{
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  bool bVar1;
  BOOL BVar2;
  undefined1 local_38 [8];
  ModuleNameRecord moduleNameRecord;
  PropertyRecord *propertyRecord;
  undefined4 local_18;
  SimpleDictionaryPropertyDescriptor<int> propertyDescriptor;
  PropertyId propertyId_local;
  
  propertyRecord._4_1_ = (propertyRecord._4_1_ & 0xf0) + 1;
  propertyRecord._5_1_ = 7;
  local_18 = 0xffffffff;
  propertyDescriptor._0_4_ = propertyId;
  moduleNameRecord._8_8_ =
       ThreadContext::GetPropertyName
                 (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                  threadContext,propertyId);
  if (((PropertyRecord *)moduleNameRecord._8_8_)->isSymbol == true) {
    BVar2 = DynamicObject::IsEnumerable(&this->super_DynamicObject,propertyDescriptor._0_4_);
    return BVar2;
  }
  this_00 = (this->propertyMap).ptr;
  if ((this_00 !=
       (BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
        *)0x0) &&
     (bVar1 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
              ::TryGetValue<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                          *)this_00,(PropertyRecord **)&moduleNameRecord.bindingName,
                         (SimpleDictionaryPropertyDescriptor<int> *)((long)&propertyRecord + 4)),
     bVar1)) {
    return propertyRecord._5_1_ & 1;
  }
  this_01 = (this->unambiguousNonLocalExports).ptr;
  if (this_01 !=
      (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    local_38 = (undefined1  [8])0x0;
    bVar1 = JsUtil::
            BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<int>(this_01,(int *)&propertyDescriptor,(ModuleNameRecord *)local_38);
    if (bVar1) {
      return 1;
    }
  }
  BVar2 = DynamicObject::IsEnumerable(&this->super_DynamicObject,propertyDescriptor._0_4_);
  return BVar2;
}

Assistant:

BOOL ModuleNamespace::IsEnumerable(PropertyId propertyId)
    {
        SimpleDictionaryPropertyDescriptor<BigPropertyIndex> propertyDescriptor;
        const Js::PropertyRecord* propertyRecord = GetScriptContext()->GetThreadContext()->GetPropertyName(propertyId);
        if (propertyRecord->IsSymbol())
        {
            return this->DynamicObject::IsEnumerable(propertyId);
        }

        if (propertyMap != nullptr && propertyMap->TryGetValue(propertyRecord, &propertyDescriptor))
        {
            return !!(propertyDescriptor.Attributes & PropertyEnumerable);
        }

        if (unambiguousNonLocalExports != nullptr)
        {
            ModuleNameRecord moduleNameRecord;
            if (unambiguousNonLocalExports->TryGetValue(propertyId, &moduleNameRecord))
            {
                return !!(PropertyModuleNamespaceDefault & PropertyEnumerable);
            }
        }

        return DynamicObject::IsEnumerable(propertyId);
    }